

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QWizardField>::emplace<QWizardField_const&>
          (QMovableArrayOps<QWizardField> *this,qsizetype i,QWizardField *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QWizardField> *in_RSI;
  QArrayDataPointer<QWizardField> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QWizardField tmp;
  QWizardField *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff34;
  byte bVar6;
  GrowthPosition where;
  undefined1 local_88 [128];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QWizardField>::needsDetach
                    ((QArrayDataPointer<QWizardField> *)
                     CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QWizardField> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QWizardField>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QWizardField>::end
                ((QArrayDataPointer<QWizardField> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      QWizardField::QWizardField
                ((QWizardField *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_007ca198;
    }
    if ((in_RSI == (QArrayDataPointer<QWizardField> *)0x0) &&
       (qVar3 = QArrayDataPointer<QWizardField>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QWizardField>::begin((QArrayDataPointer<QWizardField> *)0x7ca06a);
      QWizardField::QWizardField
                ((QWizardField *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_007ca198;
    }
  }
  memset(local_88,0xaa,0x80);
  QWizardField::QWizardField
            ((QWizardField *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QWizardField> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QWizardField> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QWizardField>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff34,uVar2))),
             (QWizardField **)in_RDI,
             (QArrayDataPointer<QWizardField> *)CONCAT17(uVar5,in_stack_ffffffffffffff20));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff34,uVar2))),
                       in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff20),
                       (qsizetype)in_stack_ffffffffffffff18);
    Inserter::insertOne((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
    Inserter::~Inserter((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff20));
  }
  else {
    QArrayDataPointer<QWizardField>::begin((QArrayDataPointer<QWizardField> *)0x7ca12c);
    QWizardField::QWizardField
              ((QWizardField *)CONCAT17(uVar5,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QWizardField::~QWizardField((QWizardField *)CONCAT17(uVar5,in_stack_ffffffffffffff20));
LAB_007ca198:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }